

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void UnixVfs_Username(jx9_context *pCtx)

{
  __uid_t __uid;
  passwd *ppVar1;
  uid_t uid;
  passwd *pwd;
  jx9_context *pCtx_local;
  
  __uid = getuid();
  ppVar1 = getpwuid(__uid);
  if (ppVar1 != (passwd *)0x0) {
    jx9_result_string(pCtx,ppVar1->pw_name,-1);
  }
  return;
}

Assistant:

static void UnixVfs_Username(jx9_context *pCtx)
{
#ifndef JX9_UNIX_STATIC_BUILD
  struct passwd *pwd;
  uid_t uid;
  uid = getuid();
  pwd = getpwuid(uid);   /* Try getting UID for username */
  if (pwd == 0) {
    return;
  }
  /* Return the username */
  jx9_result_string(pCtx, pwd->pw_name, -1);
#else
  jx9_result_string(pCtx, "Unknown", -1);
#endif /* JX9_UNIX_STATIC_BUILD */
  return;
}